

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveFinder.cpp
# Opt level: O3

void __thiscall
senjo::MoveFinder::AddKnightMoves
          (MoveFinder *this,
          set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_> *origins,
          int x,int y,char cap,list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *moves)

{
  _Rb_tree_color _Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Rb_tree_color _Var4;
  int iVar5;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  Square local_64;
  int local_60;
  int local_5c;
  int local_58;
  ChessMove local_54;
  MoveFinder *local_48;
  list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *local_40;
  int local_34;
  
  local_54.cap = '\0';
  local_54.promo = '\0';
  local_54.to.sqr = 0x78;
  p_Var3 = (origins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(origins->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var6) {
    _Var1 = y * 0x10 + x;
    if (7 < (uint)(y | x)) {
      _Var1 = 0x78;
    }
    local_34 = _Var1 + 0x77;
    local_58 = (int)cap;
    local_60 = x;
    local_5c = y;
    local_48 = this;
    local_40 = moves;
    do {
      local_54.from.sqr = p_Var3[1]._M_color;
      iVar5 = 0;
      _Var4 = 0x78;
      if (((local_54.from.sqr | _Var1) & 0xffffff88) == _S_red) {
        iVar5 = *(int *)(Square::DirectionTo(senjo::Square_const&)::DIRECTION +
                        (ulong)(uint)(local_34 - local_54.from.sqr) * 4);
        if (iVar5 < 0) {
          if (iVar5 < -0x12) {
            if (iVar5 == -0x21) goto LAB_0013c4e1;
            if (iVar5 != -0x1f) goto LAB_0013c7a9;
            goto LAB_0013c542;
          }
          if (iVar5 == -0x12) goto LAB_0013c59c;
LAB_0013c5e8:
          if (iVar5 == -0xe) goto LAB_0013c5f1;
        }
        else {
          bVar7 = true;
          bVar2 = false;
          if (iVar5 < 0x12) {
            if (iVar5 == 0) goto LAB_0013c4e1;
            if (iVar5 != 0xe) goto LAB_0013c7a9;
            goto LAB_0013c650;
          }
          if (iVar5 == 0x12) goto LAB_0013c6ae;
          if (iVar5 == 0x1f) goto LAB_0013c70c;
          if (iVar5 != 0x21) goto LAB_0013c7a9;
LAB_0013c763:
          local_64.sqr = local_54.from.sqr + 0x21;
          if ((local_54.from.sqr + 0x21 & 0xffffff88) != _S_red) {
            local_64.sqr = _Var4;
          }
          if (!bVar7) {
            local_64.sqr = 0x78;
          }
          if ((local_64.sqr & 0xffffff88) == _S_red) {
            AddMove(local_48,&local_54,&local_64,local_60,local_5c,(char)local_58,local_40);
          }
        }
      }
      else {
LAB_0013c4e1:
        local_64.sqr = local_54.from.sqr - 0x21;
        if (((local_54.from.sqr | local_64.sqr) & 0xffffff88) != _S_red) {
          local_64.sqr = 0x78;
        }
        if ((local_64.sqr & 0xffffff88) == _S_red) {
          AddMove(local_48,&local_54,&local_64,local_60,local_5c,(char)local_58,local_40);
        }
        if (iVar5 < -0xe) {
          if (iVar5 == -0x1f) {
LAB_0013c542:
            local_64.sqr = local_54.from.sqr - 0x1f;
            if (((local_54.from.sqr | local_64.sqr) & 0xffffff88) != _S_red) {
              local_64.sqr = 0x78;
            }
            if ((local_64.sqr & 0xffffff88) == _S_red) {
              AddMove(local_48,&local_54,&local_64,local_60,local_5c,(char)local_58,local_40);
            }
            if (iVar5 != 0) {
              if (iVar5 == -0xe) goto LAB_0013c5f1;
              goto LAB_0013c593;
            }
          }
          else {
LAB_0013c593:
            if (iVar5 != -0x12) goto LAB_0013c7a9;
          }
LAB_0013c59c:
          local_64.sqr = local_54.from.sqr - 0x12;
          if (((local_54.from.sqr | local_64.sqr) & 0xffffff88) != _S_red) {
            local_64.sqr = 0x78;
          }
          if ((local_64.sqr & 0xffffff88) == _S_red) {
            AddMove(local_48,&local_54,&local_64,local_60,local_5c,(char)local_58,local_40);
          }
          if (iVar5 != 0) goto LAB_0013c5e8;
        }
        else if (iVar5 != -0xe) {
          if (iVar5 == 0) goto LAB_0013c542;
          goto LAB_0013c7a9;
        }
LAB_0013c5f1:
        local_64.sqr = local_54.from.sqr - 0xe;
        if (((local_54.from.sqr | local_64.sqr) & 0xffffff88) != _S_red) {
          local_64.sqr = 0x78;
        }
        if ((local_64.sqr & 0xffffff88) == _S_red) {
          AddMove(local_48,&local_54,&local_64,local_60,local_5c,(char)local_58,local_40);
        }
        if (iVar5 == 0) {
          bVar7 = (local_54.from.sqr & 0xffffff88) == _S_red;
          bVar2 = true;
LAB_0013c650:
          local_64.sqr = local_54.from.sqr + 0xe;
          if ((local_54.from.sqr + 0xe & 0xffffff88) != _S_red) {
            local_64.sqr = 0x78;
          }
          if (!bVar7) {
            local_64.sqr = 0x78;
          }
          if ((local_64.sqr & 0xffffff88) == _S_red) {
            AddMove(local_48,&local_54,&local_64,local_60,local_5c,(char)local_58,local_40);
          }
          if (bVar2) {
            bVar7 = (local_54.from.sqr & 0xffffff88) == _S_red;
            bVar2 = true;
LAB_0013c6ae:
            local_64.sqr = local_54.from.sqr + 0x12;
            if ((local_54.from.sqr + 0x12 & 0xffffff88) != _S_red) {
              local_64.sqr = _Var4;
            }
            if (!bVar7) {
              local_64.sqr = 0x78;
            }
            if ((local_64.sqr & 0xffffff88) == _S_red) {
              AddMove(local_48,&local_54,&local_64,local_60,local_5c,(char)local_58,local_40);
            }
            if (bVar2) {
              bVar7 = (local_54.from.sqr & 0xffffff88) == _S_red;
              bVar2 = true;
LAB_0013c70c:
              local_64.sqr = local_54.from.sqr + 0x1f;
              if ((local_54.from.sqr + 0x1f & 0xffffff88) != _S_red) {
                local_64.sqr = _Var4;
              }
              if (!bVar7) {
                local_64.sqr = 0x78;
              }
              if ((local_64.sqr & 0xffffff88) == _S_red) {
                AddMove(local_48,&local_54,&local_64,local_60,local_5c,(char)local_58,local_40);
              }
              if (bVar2) {
                bVar7 = (local_54.from.sqr & 0xffffff88) == _S_red;
                goto LAB_0013c763;
              }
            }
          }
        }
      }
LAB_0013c7a9:
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var6);
  }
  return;
}

Assistant:

void MoveFinder::AddKnightMoves(const std::set<Square>& origins,
                                const int x, const int y, const char cap,
                                std::list<ChessMove>& moves) const
{
  ChessMove move;
  Direction direction;
  Square    dest;
  std::set<Square>::const_iterator it;
  for (it = origins.begin(); it != origins.end(); ++it) {
    move.from = *it;
    direction = move.from.DirectionTo(Square(x, y));
    if ((direction == Direction::Unknown) || (direction == KnightMove1)) {
      if ((dest = (move.from + KnightMove1)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove2)) {
      if ((dest = (move.from + KnightMove2)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove3)) {
      if ((dest = (move.from + KnightMove3)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove4)) {
      if ((dest = (move.from + KnightMove4)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove5)) {
      if ((dest = (move.from + KnightMove5)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove6)) {
      if ((dest = (move.from + KnightMove6)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove7)) {
      if ((dest = (move.from + KnightMove7)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove8)) {
      if ((dest = (move.from + KnightMove8)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
  }
}